

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_finish_entry(archive_write *a)

{
  zip_conflict *zip_00;
  uint16_t uVar1;
  int iVar2;
  uchar *__dest;
  uint32_t local_a8;
  uint32_t local_98;
  uint32_t local_88;
  uchar *zd;
  uchar *z;
  uchar zip64 [32];
  char d [24];
  size_t remainder;
  int ret;
  zip_conflict *zip;
  archive_write *a_local;
  
  zip_00 = (zip_conflict *)a->format_data;
  if (zip_00->entry_compression == COMPRESSION_DEFLATE) {
    while (iVar2 = cm_zlib_deflate((z_streamp)&zip_00->stream,4), iVar2 != -2) {
      d._16_8_ = zip_00->len_buf - (ulong)(zip_00->stream).avail_out;
      iVar2 = __archive_write_output(a,zip_00->buf,d._16_8_);
      if (iVar2 != 0) {
        return iVar2;
      }
      zip_00->entry_compressed_written = d._16_8_ + zip_00->entry_compressed_written;
      zip_00->written_bytes = d._16_8_ + zip_00->written_bytes;
      (zip_00->stream).next_out = zip_00->buf;
      if ((zip_00->stream).avail_out != 0) {
        cm_zlib_deflateEnd((z_streamp)&zip_00->stream);
        goto LAB_00896897;
      }
      (zip_00->stream).avail_out = (uInt)zip_00->len_buf;
    }
    a_local._4_4_ = -0x1e;
  }
  else {
LAB_00896897:
    if ((zip_00->entry_flags & 8U) != 0) {
      builtin_memcpy(zip64 + 0x18,"PK\a\b",4);
      archive_le32enc(zip64 + 0x1c,zip_00->entry_crc32);
      if (zip_00->entry_uses_zip64 == 0) {
        archive_le32enc(d,(uint32_t)zip_00->entry_compressed_written);
        archive_le32enc(d + 4,(uint32_t)zip_00->entry_uncompressed_written);
        remainder._4_4_ = __archive_write_output(a,zip64 + 0x18,0x10);
        zip_00->written_bytes = zip_00->written_bytes + 0x10;
      }
      else {
        archive_le64enc(d,zip_00->entry_compressed_written);
        archive_le64enc(d + 8,zip_00->entry_uncompressed_written);
        remainder._4_4_ = __archive_write_output(a,zip64 + 0x18,0x18);
        zip_00->written_bytes = zip_00->written_bytes + 0x18;
      }
      if (remainder._4_4_ != 0) {
        return -0x1e;
      }
    }
    if (((0xffffffff < zip_00->entry_compressed_written) ||
        (0xffffffff < zip_00->entry_uncompressed_written)) || (0xffffffff < zip_00->entry_offset)) {
      z._0_4_ = 1;
      zd = (uchar *)((long)&z + 4);
      if (0xfffffffe < zip_00->entry_uncompressed_written) {
        archive_le64enc(zd,zip_00->entry_uncompressed_written);
        zd = zip64 + 4;
      }
      if (0xfffffffe < zip_00->entry_compressed_written) {
        archive_le64enc(zd,zip_00->entry_compressed_written);
        zd = zd + 8;
      }
      if (0xfffffffe < zip_00->entry_offset) {
        archive_le64enc(zd,zip_00->entry_offset);
        zd = zd + 8;
      }
      archive_le16enc((void *)((long)&z + 2),(short)zd - ((short)&z + 4));
      __dest = cd_alloc(zip_00,(long)zd - (long)&z);
      if (__dest == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
        return -0x1e;
      }
      memcpy(__dest,&z,(long)zd - (long)&z);
      uVar1 = archive_le16dec(zip_00->file_header + 6);
      if (uVar1 < 0x2d) {
        archive_le16enc(zip_00->file_header + 6,0x2d);
      }
    }
    archive_le32enc(zip_00->file_header + 0x10,zip_00->entry_crc32);
    if (zip_00->entry_compressed_written < 0x100000000) {
      local_88 = (uint32_t)zip_00->entry_compressed_written;
    }
    else {
      local_88 = 0xffffffff;
    }
    archive_le32enc(zip_00->file_header + 0x14,local_88);
    if (zip_00->entry_uncompressed_written < 0x100000000) {
      local_98 = (uint32_t)zip_00->entry_uncompressed_written;
    }
    else {
      local_98 = 0xffffffff;
    }
    archive_le32enc(zip_00->file_header + 0x18,local_98);
    archive_le16enc(zip_00->file_header + 0x1e,
                    (short)zip_00->central_directory_bytes - (short)zip_00->file_header_extra_offset
                   );
    if (zip_00->entry_offset < 0x100000000) {
      local_a8 = (uint32_t)zip_00->entry_offset;
    }
    else {
      local_a8 = 0xffffffff;
    }
    archive_le32enc(zip_00->file_header + 0x2a,local_a8);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;
			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8, (uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16, (uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8, (uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12, (uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_uncompressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_offset > ARCHIVE_LITERAL_LL(0xffffffff)) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, z - (zip64 + 4));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
	    zipmin(zip->entry_compressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le32enc(zip->file_header + 24,
	    zipmin(zip->entry_uncompressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le16enc(zip->file_header + 30,
	    zip->central_directory_bytes - zip->file_header_extra_offset);
	archive_le32enc(zip->file_header + 42,
	    zipmin(zip->entry_offset, ARCHIVE_LITERAL_LL(0xffffffff)));

	return (ARCHIVE_OK);
}